

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O2

int run_test_tcp_connect_timeout(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("8.8.8.8",9999,&addr);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,&timer);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_timer_start(&timer,timer_cb,0x32,0);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        uVar2 = uv_default_loop();
        iVar1 = uv_tcp_init(uVar2,&conn);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_tcp_connect(&connect_req,&conn,&addr,connect_cb);
          if (iVar1 == -0x65) {
            fprintf(_stderr,"%s\n","Network unreachable.");
            fflush(_stderr);
            return 7;
          }
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_run(uVar2,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              loop = (uv_loop_t *)uv_default_loop();
              close_loop(loop);
              eval_a = 0;
              uVar2 = uv_default_loop();
              iVar1 = uv_loop_close(uVar2);
              eval_b = (int64_t)iVar1;
              if (eval_b == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar4 = "uv_loop_close(uv_default_loop())";
              pcVar3 = "0";
              uVar2 = 0x59;
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar2 = 0x57;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "r";
            uVar2 = 0x54;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0x4c;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x49;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x46;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"8.8.8.8\", 9999, &addr)";
    uVar2 = 0x43;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-timeout.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(tcp_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("8.8.8.8", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, timer_cb, 50, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}